

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall VWReaderHandler<false>::Null(VWReaderHandler<false> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Context<false> *in_RDI;
  
  iVar2 = (**in_RDI->current_state->_vptr_BaseState)();
  bVar1 = Context<false>::TransitionState(in_RDI,(BaseState<false> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool Null() { return ctx.TransitionState(ctx.current_state->Null(ctx)); }